

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

string * __thiscall
jsonrpccxx::type_name_abi_cxx11_(string *__return_storage_ptr__,jsonrpccxx *this,value_t t)

{
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [19];
  allocator<char> local_12;
  undefined1 local_11;
  string *psStack_10;
  value_t t_local;
  
  local_11 = SUB81(this,0);
  psStack_10 = __return_storage_ptr__;
  switch(local_11) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"object",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"array",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"string",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"boolean",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"integer",&local_12);
    std::allocator<char>::~allocator(&local_12);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"unsigned integer",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"float",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string type_name(json::value_t t) {
    switch (t) {
    case json::value_t::number_integer:
      return "integer";
    case json::value_t::boolean:
      return "boolean";
    case json::value_t::number_float:
      return "float";
    case json::value_t::number_unsigned:
      return "unsigned integer";
    case json::value_t::object:
      return "object";
    case json::value_t::array:
      return "array";
    case json::value_t::string:
      return "string";
    default:
      return "null";
    }
  }